

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prwlock_test.cpp
# Opt level: O0

void * reader_thread_func(void *data)

{
  int iVar1;
  int local_14;
  pint counter;
  void *data_local;
  
  local_14 = 0;
  while (iVar1 = p_atomic_int_get(&writers_counter), iVar1 == 0) {
    p_uthread_sleep(10);
  }
  while (is_threads_working == 1) {
    p_uthread_sleep(10);
    iVar1 = p_rwlock_reader_trylock(test_rwlock);
    if ((iVar1 == 0) && (iVar1 = p_rwlock_reader_lock(test_rwlock), iVar1 == 0)) {
      p_uthread_exit(0xffffffff);
    }
    iVar1 = strcmp(string_buf,"This is a test string.");
    if ((iVar1 != 0) && (iVar1 = strcmp(string_buf,"Ouh, yet another string to check!"), iVar1 != 0)
       ) {
      p_rwlock_reader_unlock(test_rwlock);
      p_uthread_exit(0xffffffff);
    }
    iVar1 = p_rwlock_reader_unlock(test_rwlock);
    if (iVar1 == 0) {
      p_uthread_exit(0xffffffff);
    }
    local_14 = local_14 + 1;
  }
  p_uthread_exit(local_14);
  return (void *)0x0;
}

Assistant:

static void * reader_thread_func (void *data)
{
	P_UNUSED (data);

	pint counter = 0;

	while (p_atomic_int_get (&writers_counter) == 0)
		p_uthread_sleep (10);

	while (is_threads_working == TRUE) {
		p_uthread_sleep (10);

		if (p_rwlock_reader_trylock (test_rwlock) == FALSE) {
			if (p_rwlock_reader_lock (test_rwlock) == FALSE)
				p_uthread_exit (-1);
		}

		if (strcmp (string_buf, PRWLOCK_TEST_STRING_1) != 0 &&
		    strcmp (string_buf, PRWLOCK_TEST_STRING_2) != 0) {
			p_rwlock_reader_unlock (test_rwlock);
			p_uthread_exit (-1);
		}

		if (p_rwlock_reader_unlock (test_rwlock) == FALSE)
			p_uthread_exit (-1);

		++counter;
	}

	p_uthread_exit (counter);

	return NULL;
}